

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_expression.cpp
# Opt level: O2

bool __thiscall
duckdb::BoundCastExpression::Equals(BoundCastExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  int iVar2;
  BoundCastExpression *pBVar3;
  type pEVar4;
  type pEVar5;
  
  bVar1 = Expression::Equals(&this->super_Expression,other_p);
  if (bVar1) {
    pBVar3 = BaseExpression::Cast<duckdb::BoundCastExpression>(other_p);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this->child);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar3->child);
    iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[10])(pEVar4,pEVar5);
    if ((char)iVar2 != '\0') {
      return this->try_cast == pBVar3->try_cast;
    }
  }
  return false;
}

Assistant:

bool BoundCastExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundCastExpression>();
	if (!Expression::Equals(*child, *other.child)) {
		return false;
	}
	if (try_cast != other.try_cast) {
		return false;
	}
	return true;
}